

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_drawpixels.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  ulong uVar2;
  float *pfVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  Point *p_3;
  Point *p_2;
  Point *p_1;
  int Y;
  int X;
  Point *p;
  int star;
  int layer;
  double length;
  double program_start;
  int total_frames;
  long frame_count;
  long elapsed;
  long now;
  long start;
  ALLEGRO_COLOR colors [3];
  float speeds [3];
  Point stars [3] [100];
  ALLEGRO_KEYBOARD_STATE key_state;
  ALLEGRO_DISPLAY *display;
  int local_a28;
  int local_a24;
  int local_a0c;
  long local_a08;
  long local_a00;
  long local_9f0;
  undefined8 local_9e8 [4];
  undefined8 local_9c8;
  float local_9b4 [605];
  undefined1 local_40 [40];
  long local_18;
  undefined4 local_4;
  
  local_4 = 0;
  local_9b4[0] = 0.0001;
  local_9b4[1] = 0.05;
  local_9b4[2] = 0.15;
  local_a0c = 0;
  uVar2 = al_install_system(0x5020700,atexit);
  if ((uVar2 & 1) == 0) {
    abort_example("Could not init Allegro.\n");
  }
  open_log();
  al_install_keyboard();
  local_18 = al_create_display(0x280,0x1e0);
  if (local_18 == 0) {
    abort_example("Could not create display.\n");
  }
  local_9e8[0] = al_map_rgba(0xff,100,0xff,0x80);
  local_9e8[2] = al_map_rgba(0xff,100);
  local_9c8 = al_map_rgba(100,100,0xff);
  for (local_a24 = 0; local_a24 < 3; local_a24 = local_a24 + 1) {
    for (local_a28 = 0; local_a28 < 100; local_a28 = local_a28 + 1) {
      iVar1 = rand();
      local_9b4[(long)local_a24 * 200 + (long)local_a28 * 2 + 3] = (float)(iVar1 % 0x280);
      iVar1 = rand();
      (local_9b4 + (long)local_a24 * 200 + (long)local_a28 * 2 + 3)[1] = (float)(iVar1 % 0x1e0);
    }
  }
  dVar5 = (double)al_get_time();
  uVar2 = 0x408f400000000000;
  local_a00 = 0;
  local_a08 = 0;
  dVar6 = (double)al_get_time();
  local_9f0 = (long)(dVar5 * 1000.0);
  do {
    if (local_a08 < 0) {
      local_a08 = local_a00 + local_a08;
    }
    else {
      uVar7 = al_map_rgb(0,0);
      al_clear_to_color(uVar7,uVar2);
      for (local_a28 = 0; local_a28 < 100; local_a28 = local_a28 + 1) {
        al_draw_pixel();
      }
      uVar7 = al_get_backbuffer(local_18);
      al_lock_bitmap(uVar7);
      for (local_a24 = 1; local_a24 < 3; local_a24 = local_a24 + 1) {
        for (local_a28 = 0; local_a28 < 100; local_a28 = local_a28 + 1) {
          al_put_pixel(local_9e8[(long)local_a24 * 2],local_9e8[(long)local_a24 * 2 + 1],
                       (int)local_9b4[(long)local_a24 * 200 + (long)local_a28 * 2 + 3]);
        }
      }
      uVar8 = 0x3f800000;
      uVar7 = al_map_rgb_f();
      al_put_pixel(uVar7,uVar8,0);
      uVar8 = 0x3f800000;
      uVar7 = al_map_rgb_f();
      al_put_pixel(uVar7,uVar8,0x27f,0);
      uVar8 = 0x3f800000;
      uVar7 = al_map_rgb_f();
      al_put_pixel(uVar7,uVar8,0,0x1df);
      uVar8 = 0x3f800000;
      uVar7 = al_map_rgb_f();
      al_put_pixel(uVar7,uVar8,0x27f,0x1df);
      uVar7 = al_get_backbuffer(local_18);
      al_unlock_bitmap(uVar7);
      al_flip_display();
      local_a0c = local_a0c + 1;
    }
    dVar5 = (double)al_get_time();
    uVar2 = 0x408f400000000000;
    local_a00 = (long)(dVar5 * 1000.0) - local_9f0;
    for (local_a24 = 0; local_a24 < 3; local_a24 = local_a24 + 1) {
      for (local_a28 = 0; local_a28 < 100; local_a28 = local_a28 + 1) {
        pfVar3 = local_9b4 + (long)local_a24 * 200 + (long)local_a28 * 2 + 3;
        uVar2 = (ulong)(uint)pfVar3[1];
        pfVar3[1] = -local_9b4[local_a24] * (float)local_a00 + pfVar3[1];
        if (pfVar3[1] <= 0.0 && pfVar3[1] != 0.0) {
          iVar1 = rand();
          *pfVar3 = (float)(iVar1 % 0x280);
          pfVar3[1] = 480.0;
        }
      }
    }
    al_rest(0x3f50624dd2f1a9fc);
    al_get_keyboard_state(local_40);
    uVar4 = al_key_down(local_40,0x3b);
    local_9f0 = (long)(dVar5 * 1000.0);
  } while ((uVar4 & 1) == 0);
  dVar5 = (double)al_get_time();
  dVar5 = dVar5 - dVar6;
  if ((dVar5 != 0.0) || (NAN(dVar5))) {
    log_printf("%d FPS\n",(ulong)(uint)(int)((double)local_a0c / dVar5));
  }
  al_destroy_display(local_18);
  close_log(true);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_KEYBOARD_STATE key_state;
   Point stars[3][NUM_STARS/3];
   float speeds[3] = { 0.0001f, 0.05f, 0.15f };
   ALLEGRO_COLOR colors[3];
   long start, now, elapsed, frame_count;
   int total_frames = 0;
   double program_start;
   double length;
   int layer, star;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }

   open_log();

   al_install_keyboard();
   
   display = al_create_display(WIDTH, HEIGHT);
   if (!display) {
      abort_example("Could not create display.\n");
   }

   colors[0] = al_map_rgba(255, 100, 255, 128);
   colors[1] = al_map_rgba(255, 100, 100, 255);
   colors[2] = al_map_rgba(100, 100, 255, 255);
         
   for (layer = 0; layer < 3; layer++) {
      for (star = 0; star < NUM_STARS/3; star++) {
         Point *p = &stars[layer][star];
         p->x = rand() % WIDTH;
         p->y = rand() % HEIGHT;
      }
   }


   start = al_get_time() * 1000;
   now = start;
   elapsed = 0;
   frame_count = 0;
   program_start = al_get_time();


   while (1) {
      if (frame_count < (1000/TARGET_FPS)) {
         frame_count += elapsed;
      }
      else {
         int X, Y;

         frame_count -= (1000/TARGET_FPS);
         al_clear_to_color(al_map_rgb(0, 0, 0));
         for (star = 0; star < NUM_STARS/3; star++) {
            Point *p = &stars[0][star];
            al_draw_pixel(p->x, p->y, colors[0]);
         }
         al_lock_bitmap(al_get_backbuffer(display), ALLEGRO_PIXEL_FORMAT_ANY, 0);

         for (layer = 1; layer < 3; layer++) {
            for (star = 0; star < NUM_STARS/3; star++) {
               Point *p = &stars[layer][star];
               // put_pixel ignores blending
               al_put_pixel(p->x, p->y, colors[layer]);
            }
         }

         /* Check that dots appear at the window extremes. */
         X = WIDTH - 1;
         Y = HEIGHT - 1;
         al_put_pixel(0, 0, al_map_rgb_f(1, 1, 1));
         al_put_pixel(X, 0, al_map_rgb_f(1, 1, 1));
         al_put_pixel(0, Y, al_map_rgb_f(1, 1, 1));
         al_put_pixel(X, Y, al_map_rgb_f(1, 1, 1));

         al_unlock_bitmap(al_get_backbuffer(display));
         al_flip_display();
         total_frames++;
      }

      now = al_get_time() * 1000;
      elapsed = now - start;
      start = now;

      for (layer = 0; layer < 3; layer++) {
         for (star = 0; star < NUM_STARS/3; star++) {
            Point *p = &stars[layer][star];
            p->y -= speeds[layer] * elapsed;
            if (p->y < 0) {
               p->x = rand() % WIDTH;
               p->y = HEIGHT;
            }
         }
      }

      al_rest(0.001);

      al_get_keyboard_state(&key_state);
      if (al_key_down(&key_state, ALLEGRO_KEY_ESCAPE))
         break;
   }

   length = al_get_time() - program_start;

   if (length != 0) {
      log_printf("%d FPS\n", (int)(total_frames / length));
   }

   al_destroy_display(display);

   close_log(true);

   return 0;
}